

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::remove(Fl_Text_Buffer *this,char *__filename)

{
  int extraout_EAX;
  char *deletedText_00;
  int in_EDX;
  char *deletedText;
  int local_18;
  int temp;
  int end_local;
  int start_local;
  Fl_Text_Buffer *this_local;
  
  temp = (int)__filename;
  local_18 = in_EDX;
  if (in_EDX < temp) {
    local_18 = temp;
    temp = in_EDX;
  }
  if (this->mLength < temp) {
    temp = this->mLength;
  }
  if (temp < 0) {
    temp = 0;
  }
  if (this->mLength < local_18) {
    local_18 = this->mLength;
  }
  if (local_18 < 0) {
    local_18 = 0;
  }
  if (temp != local_18) {
    call_predelete_callbacks(this,temp,local_18 - temp);
    deletedText_00 = text_range(this,temp,local_18);
    remove_(this,temp,local_18);
    this->mCursorPosHint = temp;
    call_modify_callbacks(this,temp,local_18 - temp,0,0,deletedText_00);
    free(deletedText_00);
    temp = extraout_EAX;
  }
  return temp;
}

Assistant:

void Fl_Text_Buffer::remove(int start, int end)
{
  /* Make sure the arguments make sense */
  if (start > end) {
    int temp = start;
    start = end;
    end = temp;
  }
  if (start > mLength)
    start = mLength;
  if (start < 0)
    start = 0;
  if (end > mLength)
    end = mLength;
  if (end < 0)
    end = 0;

  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))  
  
  if (start == end)
    return;
  
  call_predelete_callbacks(start, end - start);
  /* Remove and redisplay */
  const char *deletedText = text_range(start, end);
  remove_(start, end);
  mCursorPosHint = start;
  call_modify_callbacks(start, end - start, 0, 0, deletedText);
  free((void *) deletedText);
}